

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1RemoveFromHash(PgHdr1 *pPage,int freeFlag)

{
  PCache1 *pPVar1;
  PgHdr1 *pPVar2;
  PgHdr1 **ppPVar3;
  PgHdr1 **ppPVar4;
  
  pPVar1 = pPage->pCache;
  ppPVar3 = pPVar1->apHash + (ulong)pPage->iKey % (ulong)pPVar1->nHash;
  do {
    ppPVar4 = ppPVar3;
    pPVar2 = *ppPVar4;
    ppPVar3 = &pPVar2->pNext;
  } while (pPVar2 != pPage);
  *ppPVar4 = *ppPVar3;
  pPVar1->nPage = pPVar1->nPage - 1;
  if (freeFlag == 0) {
    return;
  }
  pPVar1 = pPage->pCache;
  if (pPage->isBulkLocal == '\0') {
    pcache1Free((pPage->page).pBuf);
  }
  else {
    pPage->pNext = pPVar1->pFree;
    pPVar1->pFree = pPage;
  }
  *pPVar1->pnPurgeable = *pPVar1->pnPurgeable - 1;
  return;
}

Assistant:

static void pcache1RemoveFromHash(PgHdr1 *pPage, int freeFlag){
  unsigned int h;
  PCache1 *pCache = pPage->pCache;
  PgHdr1 **pp;

  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  h = pPage->iKey % pCache->nHash;
  for(pp=&pCache->apHash[h]; (*pp)!=pPage; pp=&(*pp)->pNext);
  *pp = (*pp)->pNext;

  pCache->nPage--;
  if( freeFlag ) pcache1FreePage(pPage);
}